

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O3

void __thiscall
pstore::http::
buffered_reader<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp:42:19)>
::check_invariants(buffered_reader<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_unittests_http_test_buffered_reader_cpp:42:19)>
                   *this)

{
  bool bVar1;
  int line;
  char *str;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_30;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_20;
  
  bVar1 = pstore::gsl::details::operator<=(&this->pos_,&this->end_);
  if (bVar1) {
    pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::span_iterator
              (&local_20,(this->pos_).span_,(this->pos_).index_);
    bVar1 = check_invariants::anon_class_8_1_8991fb9c::operator()
                      ((anon_class_8_1_8991fb9c *)this,&local_20);
    if (bVar1) {
      pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
      span_iterator(&local_30,(this->end_).span_,(this->end_).index_);
      bVar1 = check_invariants::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)this,&local_30);
      if (bVar1) {
        return;
      }
      line = 0x15d;
      str = "is_valid (end_)";
    }
    else {
      line = 0x15c;
      str = "is_valid (pos_)";
    }
  }
  else {
    line = 0x15b;
    str = "pos_ <= end_";
  }
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/buffered_reader.hpp"
                ,line);
}

Assistant:

void buffered_reader<IO, RefillFunction>::check_invariants () noexcept {
#ifndef NDEBUG
            auto is_valid = [this] (gsl::span<std::uint8_t>::iterator it) noexcept {
                ptrdiff_t const p = this->pos (it);
                return p >= 0 &&
                       static_cast<std::make_unsigned<ptrdiff_t>::type> (p) <= buf_.size ();
            };
            PSTORE_ASSERT (pos_ <= end_);
            PSTORE_ASSERT (is_valid (pos_));
            PSTORE_ASSERT (is_valid (end_));
#endif
        }